

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O2

int __thiscall
cppcms::applications_pool::mount
          (applications_pool *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,
          void *__data)

{
  int extraout_EAX;
  __shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  mount_point local_38;
  
  std::__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,
             (__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> *)
             __special_file);
  mount_point::mount_point(&local_38);
  mount(this,(char *)&_Stack_48,(char *)&local_38,(char *)((ulong)__dir & 0xffffffff),__rwflag,
        __data);
  mount_point::~mount_point(&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  return extraout_EAX;
}

Assistant:

void applications_pool::mount(booster::shared_ptr<application_specific_pool> gen,int flags)
{
	mount(gen,mount_point(),flags);
}